

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i y_convolve_8tap_2x2_ssse3
                  (uint8_t *src,ptrdiff_t stride,__m128i *coeffs,__m128i *s_16,__m128i *ss_128)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int16_t iVar3;
  long in_RCX;
  __m128i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i alVar4;
  __m128i src78;
  __m128i src67;
  ulong local_a8;
  ulong local_88;
  
  iVar3 = loadu_int16((void *)(in_RDI + in_RSI * 7));
  local_88 = (ulong)(uint)(int)iVar3;
  *(ulong *)(in_RCX + 0x70) = local_88;
  *(undefined8 *)(in_RCX + 0x78) = 0;
  auVar1 = vpunpcklwd_avx(*(undefined1 (*) [16])(in_RCX + 0x60),
                          *(undefined1 (*) [16])(in_RCX + 0x70));
  iVar3 = loadu_int16((void *)(in_RDI + in_RSI * 8));
  local_a8 = (ulong)(uint)(int)iVar3;
  *(ulong *)(in_RCX + 0x60) = local_a8;
  *(undefined8 *)(in_RCX + 0x68) = 0;
  auVar2 = vpunpcklwd_avx(*(undefined1 (*) [16])(in_RCX + 0x70),
                          *(undefined1 (*) [16])(in_RCX + 0x60));
  alVar4 = (__m128i)vpunpcklbw_avx(auVar1,auVar2);
  in_R8[3] = alVar4;
  alVar4 = convolve_8tap_ssse3(in_R8,in_RDX);
  alVar4[0] = alVar4[0];
  alVar4[1] = alVar4[1];
  return alVar4;
}

Assistant:

static inline __m128i y_convolve_8tap_2x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[4],
                                                __m128i s_16[8],
                                                __m128i ss_128[4]) {
  s_16[7] = _mm_cvtsi32_si128(loadu_int16(src + 7 * stride));
  const __m128i src67 = _mm_unpacklo_epi16(s_16[6], s_16[7]);
  s_16[6] = _mm_cvtsi32_si128(loadu_int16(src + 8 * stride));
  const __m128i src78 = _mm_unpacklo_epi16(s_16[7], s_16[6]);
  ss_128[3] = _mm_unpacklo_epi8(src67, src78);
  return convolve_8tap_ssse3(ss_128, coeffs);
}